

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

bool __thiscall chaiscript::parser::ChaiScript_Parser::Case(ChaiScript_Parser *this)

{
  bool bVar1;
  eval_error *peVar2;
  string *this_00;
  size_t t_match_start;
  allocator local_81;
  File_Position local_80;
  string local_78;
  string local_58;
  string local_38;
  
  t_match_start =
       (long)(this->m_match_stack).
             super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->m_match_stack).
             super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4;
  bVar1 = Keyword(this,"case",false);
  if (bVar1) {
    bVar1 = Char(this,'(',false);
    if (!bVar1) {
      peVar2 = (eval_error *)__cxa_allocate_exception(0x90);
      std::__cxx11::string::string((string *)&local_78,"Incomplete \'case\' expression",&local_81);
      local_80.line = (this->m_position).line;
      local_80.column = (this->m_position).col;
      exception::eval_error::eval_error
                (peVar2,&local_78,&local_80,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(peVar2,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    bVar1 = Operator(this,0);
    if ((!bVar1) || (bVar1 = Char(this,')',false), !bVar1)) {
      peVar2 = (eval_error *)__cxa_allocate_exception(0x90);
      std::__cxx11::string::string((string *)&local_78,"Incomplete \'case\' expression",&local_81);
      local_80.line = (this->m_position).line;
      local_80.column = (this->m_position).col;
      exception::eval_error::eval_error
                (peVar2,&local_78,&local_80,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(peVar2,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    do {
      bVar1 = Eol(this);
    } while (bVar1);
    bVar1 = Block(this);
    if (!bVar1) {
      peVar2 = (eval_error *)__cxa_allocate_exception(0x90);
      std::__cxx11::string::string((string *)&local_78,"Incomplete \'case\' block",&local_81);
      local_80.line = (this->m_position).line;
      local_80.column = (this->m_position).col;
      exception::eval_error::eval_error
                (peVar2,&local_78,&local_80,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(peVar2,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    std::__cxx11::string::string((string *)&local_38,"",(allocator *)&local_78);
    build_match<chaiscript::eval::Case_AST_Node>(this,t_match_start,&local_38);
    this_00 = &local_38;
  }
  else {
    bVar1 = Keyword(this,"default",false);
    if (!bVar1) {
      return false;
    }
    do {
      bVar1 = Eol(this);
    } while (bVar1);
    bVar1 = Block(this);
    if (!bVar1) {
      peVar2 = (eval_error *)__cxa_allocate_exception(0x90);
      std::__cxx11::string::string((string *)&local_78,"Incomplete \'default\' block",&local_81);
      local_80.line = (this->m_position).line;
      local_80.column = (this->m_position).col;
      exception::eval_error::eval_error
                (peVar2,&local_78,&local_80,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(peVar2,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    std::__cxx11::string::string((string *)&local_58,"",(allocator *)&local_78);
    build_match<chaiscript::eval::Default_AST_Node>(this,t_match_start,&local_58);
    this_00 = &local_58;
  }
  std::__cxx11::string::~string((string *)this_00);
  return true;
}

Assistant:

bool Case() {
        bool retval = false;

        const auto prev_stack_top = m_match_stack.size();

        if (Keyword("case")) {
          retval = true;

          if (!Char('(')) {
            throw exception::eval_error("Incomplete 'case' expression", File_Position(m_position.line, m_position.col), *m_filename);
          }

          if (!(Operator() && Char(')'))) {
            throw exception::eval_error("Incomplete 'case' expression", File_Position(m_position.line, m_position.col), *m_filename);
          }

          while (Eol()) {}

          if (!Block()) {
            throw exception::eval_error("Incomplete 'case' block", File_Position(m_position.line, m_position.col), *m_filename);
          }

          build_match<eval::Case_AST_Node>(prev_stack_top);
        } else if (Keyword("default")) {
          retval = true;

          while (Eol()) {}

          if (!Block()) {
            throw exception::eval_error("Incomplete 'default' block", File_Position(m_position.line, m_position.col), *m_filename);
          }

          build_match<eval::Default_AST_Node>(prev_stack_top);
        }

        return retval;
      }